

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,texcoord2f *value)

{
  bool bVar1;
  float2 v;
  array<float,_2UL> local_10;
  
  bVar1 = ParseBasicTypeTuple<float,2ul>(this,&local_10);
  if (bVar1) {
    value->s = local_10._M_elems[0];
    value->t = local_10._M_elems[1];
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::texcoord2f *value) {
  value::float2 v;
  if (ParseBasicTypeTuple(&v)) {
    value->s = v[0];
    value->t = v[1];
    return true;
  }
  return false;
}